

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlRemoveID(xmlDocPtr doc,xmlAttrPtr attr)

{
  int iVar1;
  xmlIDTablePtr table;
  xmlAttrPtr attr_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else if ((attr == (xmlAttrPtr)0x0) || (attr->id == (_xmlID *)0x0)) {
    doc_local._4_4_ = -1;
  }
  else if ((xmlHashTablePtr)doc->ids == (xmlHashTablePtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlHashRemoveEntry((xmlHashTablePtr)doc->ids,attr->id->value,xmlFreeIDTableEntry);
    if (iVar1 < 0) {
      doc_local._4_4_ = -1;
    }
    else {
      doc_local._4_4_ = 0;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlRemoveID(xmlDocPtr doc, xmlAttrPtr attr) {
    xmlIDTablePtr table;

    if (doc == NULL) return(-1);
    if ((attr == NULL) || (attr->id == NULL)) return(-1);

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(-1);

    if (xmlHashRemoveEntry(table, attr->id->value, xmlFreeIDTableEntry) < 0)
        return(-1);

    return(0);
}